

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O0

int vx__triangle_box_overlap(vx_vertex_t boxcenter,vx_vertex_t halfboxsize,vx_triangle_t triangle)

{
  int iVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  vx_vertex_t vVar6;
  undefined8 local_e0;
  float local_d8;
  float fez;
  float fey;
  float fex;
  float rad;
  float p3;
  float p2;
  float p1;
  float d;
  float max;
  float min;
  vx_vertex_t e3;
  vx_vertex_t e2;
  vx_vertex_t e1;
  vx_vertex_t normal;
  vx_vertex_t v3;
  vx_vertex_t v2;
  vx_vertex_t v1;
  undefined1 local_34 [8];
  vx_vertex_t halfboxsize_local;
  undefined1 local_18 [8];
  vx_vertex_t boxcenter_local;
  
  halfboxsize_local.field_0.v[0] = (float)halfboxsize.field_0._8_4_;
  local_34 = halfboxsize.field_0._0_8_;
  boxcenter_local.field_0.v[0] = (float)boxcenter.field_0._8_4_;
  halfboxsize_local.field_0._4_8_ = boxcenter.field_0._0_8_;
  v2.field_0._4_8_ = triangle.p1.field_0._0_8_;
  v3.field_0._4_8_ = triangle.p2.field_0._0_8_;
  v2.field_0.v[0] = triangle.p2.field_0.v[2];
  normal.field_0._4_8_ = triangle.p3.field_0._0_8_;
  v3.field_0.v[0] = triangle.p3.field_0.v[2];
  local_18 = (undefined1  [8])halfboxsize_local.field_0._4_8_;
  vx__vertex_sub((vx_vertex_t *)((long)&v2.field_0 + 4),(vx_vertex_t *)local_18);
  vx__vertex_sub((vx_vertex_t *)((long)&v3.field_0 + 4),(vx_vertex_t *)local_18);
  vx__vertex_sub((vx_vertex_t *)((long)&normal.field_0 + 4),(vx_vertex_t *)local_18);
  e2.field_0._4_8_ = v3.field_0._4_8_;
  e1.field_0.v[0] = v2.field_0.v[0];
  e3.field_0._4_8_ = normal.field_0._4_8_;
  e2.field_0.v[0] = v3.field_0.v[0];
  _max = v2.field_0._4_8_;
  e3.field_0.v[0] = triangle.p1.field_0.v[2];
  vx__vertex_sub((vx_vertex_t *)((long)&e2.field_0 + 4),(vx_vertex_t *)((long)&v2.field_0 + 4));
  vx__vertex_sub((vx_vertex_t *)((long)&e3.field_0 + 4),(vx_vertex_t *)((long)&v3.field_0 + 4));
  vx__vertex_sub((vx_vertex_t *)&max,(vx_vertex_t *)((long)&normal.field_0 + 4));
  dVar3 = std::fabs((double)(e2.field_0._4_8_ & 0xffffffff));
  dVar4 = std::fabs((double)((ulong)e2.field_0._4_8_ >> 0x20));
  dVar5 = std::fabs((double)(ulong)(uint)e1.field_0.v[0]);
  fVar2 = e1.field_0.v[0] * v2.field_0.v[2] + -(e2.field_0.v[2] * triangle.p1.field_0.v[2]);
  d = e1.field_0.v[0] * normal.field_0.v[2] + -(e2.field_0.v[2] * v3.field_0.v[0]);
  p1 = fVar2;
  if (fVar2 < d) {
    p1 = d;
    d = fVar2;
  }
  fVar2 = SUB84(dVar5,0) * (float)local_34._4_4_ + SUB84(dVar4,0) * halfboxsize_local.field_0.v[0];
  if ((fVar2 < d) || (p1 < -fVar2)) {
    boxcenter_local.field_0.v[1] = 0.0;
  }
  else {
    fVar2 = -e1.field_0.v[0] * v2.field_0.v[1] + e2.field_0.v[1] * triangle.p1.field_0.v[2];
    d = -e1.field_0.v[0] * normal.field_0.v[1] + e2.field_0.v[1] * v3.field_0.v[0];
    p1 = fVar2;
    if (fVar2 < d) {
      p1 = d;
      d = fVar2;
    }
    fVar2 = SUB84(dVar5,0) * (float)local_34._0_4_ + SUB84(dVar3,0) * halfboxsize_local.field_0.v[0]
    ;
    if ((fVar2 < d) || (p1 < -fVar2)) {
      boxcenter_local.field_0.v[1] = 0.0;
    }
    else {
      d = e2.field_0.v[2] * v3.field_0.v[1] + -(e2.field_0.v[1] * v3.field_0.v[2]);
      fVar2 = e2.field_0.v[2] * normal.field_0.v[1] + -(e2.field_0.v[1] * normal.field_0.v[2]);
      p1 = fVar2;
      if (fVar2 < d) {
        p1 = d;
        d = fVar2;
      }
      fVar2 = SUB84(dVar4,0) * (float)local_34._0_4_ + SUB84(dVar3,0) * (float)local_34._4_4_;
      if ((fVar2 < d) || (p1 < -fVar2)) {
        boxcenter_local.field_0.v[1] = 0.0;
      }
      else {
        dVar3 = std::fabs((double)(e3.field_0._4_8_ & 0xffffffff));
        dVar4 = std::fabs((double)((ulong)e3.field_0._4_8_ >> 0x20));
        dVar5 = std::fabs((double)(ulong)(uint)e2.field_0.v[0]);
        fVar2 = e2.field_0.v[0] * v2.field_0.v[2] + -(e3.field_0.v[2] * triangle.p1.field_0.v[2]);
        d = e2.field_0.v[0] * normal.field_0.v[2] + -(e3.field_0.v[2] * v3.field_0.v[0]);
        p1 = fVar2;
        if (fVar2 < d) {
          p1 = d;
          d = fVar2;
        }
        fVar2 = SUB84(dVar5,0) * (float)local_34._4_4_ +
                SUB84(dVar4,0) * halfboxsize_local.field_0.v[0];
        if ((fVar2 < d) || (p1 < -fVar2)) {
          boxcenter_local.field_0.v[1] = 0.0;
        }
        else {
          fVar2 = -e2.field_0.v[0] * v2.field_0.v[1] + e3.field_0.v[1] * triangle.p1.field_0.v[2];
          d = -e2.field_0.v[0] * normal.field_0.v[1] + e3.field_0.v[1] * v3.field_0.v[0];
          p1 = fVar2;
          if (fVar2 < d) {
            p1 = d;
            d = fVar2;
          }
          fVar2 = SUB84(dVar5,0) * (float)local_34._0_4_ +
                  SUB84(dVar3,0) * halfboxsize_local.field_0.v[0];
          if ((fVar2 < d) || (p1 < -fVar2)) {
            boxcenter_local.field_0.v[1] = 0.0;
          }
          else {
            fVar2 = e3.field_0.v[2] * v2.field_0.v[1] + -(e3.field_0.v[1] * v2.field_0.v[2]);
            d = e3.field_0.v[2] * v3.field_0.v[1] + -(e3.field_0.v[1] * v3.field_0.v[2]);
            p1 = fVar2;
            if (fVar2 < d) {
              p1 = d;
              d = fVar2;
            }
            fVar2 = SUB84(dVar4,0) * (float)local_34._0_4_ + SUB84(dVar3,0) * (float)local_34._4_4_;
            if ((fVar2 < d) || (p1 < -fVar2)) {
              boxcenter_local.field_0.v[1] = 0.0;
            }
            else {
              dVar3 = std::fabs((double)(_max & 0xffffffff));
              dVar4 = std::fabs((double)((ulong)_max >> 0x20));
              dVar5 = std::fabs((double)(ulong)(uint)e3.field_0.v[0]);
              fVar2 = e3.field_0.v[0] * v2.field_0.v[2] + -(min * triangle.p1.field_0.v[2]);
              d = e3.field_0.v[0] * v3.field_0.v[2] + -(min * v2.field_0.v[0]);
              p1 = fVar2;
              if (fVar2 < d) {
                p1 = d;
                d = fVar2;
              }
              fVar2 = SUB84(dVar5,0) * (float)local_34._4_4_ +
                      SUB84(dVar4,0) * halfboxsize_local.field_0.v[0];
              if ((fVar2 < d) || (p1 < -fVar2)) {
                boxcenter_local.field_0.v[1] = 0.0;
              }
              else {
                fVar2 = -e3.field_0.v[0] * v2.field_0.v[1] + max * triangle.p1.field_0.v[2];
                d = -e3.field_0.v[0] * v3.field_0.v[1] + max * v2.field_0.v[0];
                p1 = fVar2;
                if (fVar2 < d) {
                  p1 = d;
                  d = fVar2;
                }
                fVar2 = SUB84(dVar5,0) * (float)local_34._0_4_ +
                        SUB84(dVar3,0) * halfboxsize_local.field_0.v[0];
                if ((fVar2 < d) || (p1 < -fVar2)) {
                  boxcenter_local.field_0.v[1] = 0.0;
                }
                else {
                  d = min * v3.field_0.v[1] + -(max * v3.field_0.v[2]);
                  fVar2 = min * normal.field_0.v[1] + -(max * normal.field_0.v[2]);
                  p1 = fVar2;
                  if (fVar2 < d) {
                    p1 = d;
                    d = fVar2;
                  }
                  fVar2 = SUB84(dVar4,0) * (float)local_34._0_4_ +
                          SUB84(dVar3,0) * (float)local_34._4_4_;
                  if ((fVar2 < d) || (p1 < -fVar2)) {
                    boxcenter_local.field_0.v[1] = 0.0;
                  }
                  else {
                    p1 = v2.field_0.v[1];
                    d = v2.field_0.v[1];
                    if (v3.field_0.v[1] < v2.field_0.v[1]) {
                      d = v3.field_0.v[1];
                    }
                    if (v2.field_0.v[1] < v3.field_0.v[1]) {
                      p1 = v3.field_0.v[1];
                    }
                    if (normal.field_0.v[1] < d) {
                      d = normal.field_0.v[1];
                    }
                    if (p1 < normal.field_0.v[1]) {
                      p1 = normal.field_0.v[1];
                    }
                    if (((float)local_34._0_4_ < d) || (p1 < -(float)local_34._0_4_)) {
                      boxcenter_local.field_0.v[1] = 0.0;
                    }
                    else {
                      p1 = v2.field_0.v[2];
                      d = v2.field_0.v[2];
                      if (v3.field_0.v[2] < v2.field_0.v[2]) {
                        d = v3.field_0.v[2];
                      }
                      if (v2.field_0.v[2] < v3.field_0.v[2]) {
                        p1 = v3.field_0.v[2];
                      }
                      if (normal.field_0.v[2] < d) {
                        d = normal.field_0.v[2];
                      }
                      if (p1 < normal.field_0.v[2]) {
                        p1 = normal.field_0.v[2];
                      }
                      if (((float)local_34._4_4_ < d) || (p1 < -(float)local_34._4_4_)) {
                        boxcenter_local.field_0.v[1] = 0.0;
                      }
                      else {
                        p1 = triangle.p1.field_0.v[2];
                        d = triangle.p1.field_0.v[2];
                        if (v2.field_0.v[0] < triangle.p1.field_0.v[2]) {
                          d = v2.field_0.v[0];
                        }
                        if (triangle.p1.field_0.v[2] < v2.field_0.v[0]) {
                          p1 = v2.field_0.v[0];
                        }
                        if (v3.field_0.v[0] < d) {
                          d = v3.field_0.v[0];
                        }
                        if (p1 < v3.field_0.v[0]) {
                          p1 = v3.field_0.v[0];
                        }
                        if ((halfboxsize_local.field_0.v[0] < d) ||
                           (p1 < -halfboxsize_local.field_0.v[0])) {
                          boxcenter_local.field_0.v[1] = 0.0;
                        }
                        else {
                          vVar6 = vx__vertex_cross((vx_vertex_t *)((long)&e2.field_0 + 4),
                                                   (vx_vertex_t *)((long)&e3.field_0 + 4));
                          local_e0 = vVar6.field_0._0_8_;
                          local_d8 = vVar6.field_0._8_4_;
                          e1.field_0._4_8_ = local_e0;
                          normal.field_0.v[0] = local_d8;
                          fVar2 = vx__vertex_dot((vx_vertex_t *)((long)&e1.field_0 + 4),
                                                 (vx_vertex_t *)((long)&v2.field_0 + 4));
                          iVar1 = vx__plane_box_overlap
                                            ((vx_vertex_t *)((long)&e1.field_0 + 4),-fVar2,
                                             (vx_vertex_t *)local_34);
                          if (iVar1 == 0) {
                            boxcenter_local.field_0.v[1] = 0.0;
                          }
                          else {
                            boxcenter_local.field_0.v[1] = 1.4013e-45;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (int)boxcenter_local.field_0.v[1];
}

Assistant:

int vx__triangle_box_overlap(vx_vertex_t boxcenter,
    vx_vertex_t halfboxsize,
    vx_triangle_t triangle)
{
    vx_vertex_t v1, v2, v3, normal, e1, e2, e3;
    float min, max, d, p1, p2, p3, rad, fex, fey, fez;

    v1 = triangle.p1;
    v2 = triangle.p2;
    v3 = triangle.p3;

    vx__vertex_sub(&v1, &boxcenter);
    vx__vertex_sub(&v2, &boxcenter);
    vx__vertex_sub(&v3, &boxcenter);

    e1 = v2;
    e2 = v3;
    e3 = v1;

    vx__vertex_sub(&e1, &v1);
    vx__vertex_sub(&e2, &v2);
    vx__vertex_sub(&e3, &v3);

    fex = fabs(e1.x);
    fey = fabs(e1.y);
    fez = fabs(e1.z);

    AXISTEST_X01(e1.z, e1.y, fez, fey);
    AXISTEST_Y02(e1.z, e1.x, fez, fex);
    AXISTEST_Z12(e1.y, e1.x, fey, fex);

    fex = fabs(e2.x);
    fey = fabs(e2.y);
    fez = fabs(e2.z);

    AXISTEST_X01(e2.z, e2.y, fez, fey);
    AXISTEST_Y02(e2.z, e2.x, fez, fex);
    AXISTEST_Z0(e2.y, e2.x, fey, fex);

    fex = fabs(e3.x);
    fey = fabs(e3.y);
    fez = fabs(e3.z);

    AXISTEST_X2(e3.z, e3.y, fez, fey);
    AXISTEST_Y1(e3.z, e3.x, fez, fex);
    AXISTEST_Z12(e3.y, e3.x, fey, fex);

    VX_FINDMINMAX(v1.x, v2.x, v3.x, min, max);
    if (min > halfboxsize.x || max < -halfboxsize.x) {
        return false;
    }

    VX_FINDMINMAX(v1.y, v2.y, v3.y, min, max);
    if (min > halfboxsize.y || max < -halfboxsize.y) {
        return false;
    }

    VX_FINDMINMAX(v1.z, v2.z, v3.z, min, max);
    if (min > halfboxsize.z || max < -halfboxsize.z) {
        return false;
    }

    normal = vx__vertex_cross(&e1, &e2);
    d = -vx__vertex_dot(&normal, &v1);

    if (!vx__plane_box_overlap(&normal, d, &halfboxsize)) {
        return false;
    }

    return true;
}